

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
simple_json::Stream::
statement_no_return<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[5]>
          (Stream *this,char (*ts) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [5])

{
  statement_indent(this);
  statement_inner<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[5]>(this,ts,ts_1,ts_2);
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}